

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Point_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Point_Object_State_PDU *this)

{
  ostream *poVar1;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Point_Object_State_PDU *local_18;
  Point_Object_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Point_Object_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Point Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Object_State_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Modification:\n");
  poVar1 = std::operator<<(poVar1,"\tLocation:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(byte)(this->super_Object_State_Header).field_0x4b & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tOrientation:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(byte)(this->super_Object_State_Header).field_0x4b >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Object Type:  ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_210,&this->m_ObjTyp);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Location:     ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_230,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"Orientation:  ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_250,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_290,&this->m_ReqID);
  UTILS::IndentString(&local_270,&local_290,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  DATA_TYPE::PointObjectAppearance::GetAsString_abi_cxx11_(&local_2b0,&this->m_Apperance);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_2f0,&this->m_RecvID);
  UTILS::IndentString(&local_2d0,&local_2f0,1,'\t');
  std::operator<<(poVar1,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Point_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Point Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation:     " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\tOrientation:  " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << "Object Type:  "   << m_ObjTyp.GetAsString()
       << "Location:     "   << m_Loc.GetAsString()
       << "Orientation:  "   << m_Ori.GetAsString()
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << m_Apperance.GetAsString()
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 );

    return ss.str();
}